

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O0

ion_err_t linear_hash_get_bucket_swap_record
                    (int bucket_idx,ion_fpos_t *record_loc,ion_byte_t *key,ion_byte_t *value,
                    ion_byte_t *status,linear_hash_table_t *linear_hash)

{
  ion_byte_t local_5a;
  ion_err_t local_59;
  ion_byte_t deleted_status;
  long lStack_58;
  ion_err_t err;
  ion_fpos_t swap_record_loc;
  linear_hash_bucket_t bucket;
  ion_fpos_t bucket_loc;
  linear_hash_table_t *linear_hash_local;
  ion_byte_t *status_local;
  ion_byte_t *value_local;
  ion_byte_t *key_local;
  ion_fpos_t *record_loc_local;
  int bucket_idx_local;
  
  bucket.overflow_location = array_list_get(bucket_idx,linear_hash->bucket_map);
  linear_hash_get_bucket
            (bucket.overflow_location,(linear_hash_bucket_t *)&swap_record_loc,linear_hash);
  lStack_58 = bucket.overflow_location + 0x10 +
              (long)(swap_record_loc._4_4_ + -1) * linear_hash->record_total_size;
  local_59 = linear_hash_get_record(lStack_58,key,value,status,linear_hash);
  record_loc_local._7_1_ = local_59;
  if (local_59 == '\0') {
    local_5a = '\0';
    local_59 = linear_hash_write_record(lStack_58,key,value,&local_5a,linear_hash);
    record_loc_local._7_1_ = local_59;
    if (local_59 == '\0') {
      *record_loc = lStack_58;
      swap_record_loc._4_4_ = swap_record_loc._4_4_ + -1;
      if ((swap_record_loc._4_4_ == 0) && (bucket._0_8_ != -1)) {
        array_list_insert((int)swap_record_loc,bucket._0_8_,linear_hash->bucket_map);
      }
      local_59 = linear_hash_update_bucket
                           (bucket.overflow_location,(linear_hash_bucket_t *)&swap_record_loc,
                            linear_hash);
      linear_hash_decrement_num_records(linear_hash);
      if (local_59 == '\0') {
        record_loc_local._7_1_ = local_59;
      }
      else {
        record_loc_local._7_1_ = local_59;
      }
    }
  }
  return record_loc_local._7_1_;
}

Assistant:

ion_err_t
linear_hash_get_bucket_swap_record(
	int					bucket_idx,
	ion_fpos_t			*record_loc,
	ion_byte_t			*key,
	ion_byte_t			*value,
	ion_byte_t			*status,
	linear_hash_table_t *linear_hash
) {
	/* read in bucket currently swapping to obtain the last record */
	ion_fpos_t				bucket_loc = array_list_get(bucket_idx, linear_hash->bucket_map);
	linear_hash_bucket_t	bucket;

	linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

	ion_fpos_t swap_record_loc	= bucket_loc + sizeof(linear_hash_bucket_t) + ((bucket.record_count - 1) * linear_hash->record_total_size);

	/* read in the record to swap with next */
	ion_err_t err				= linear_hash_get_record(swap_record_loc, key, value, status, linear_hash);

	if (err != err_ok) {
		return err;
	}

	ion_byte_t deleted_status = linear_hash_record_status_empty;

	/* TODO JUST NEED TO WRITE STATUS HERE */
	err = linear_hash_write_record(swap_record_loc, key, value, &deleted_status, linear_hash);

	if (err != err_ok) {
		return err;
	}

	*record_loc = swap_record_loc;
	bucket.record_count--;

	/* garuntee the bucket in the bucket map has records in it - THIS LEAVES EMPTY BUCKETS FLOATING ABOUT */
	if ((bucket.record_count == 0) && (bucket.overflow_location != linear_hash_end_of_list)) {
		array_list_insert(bucket.idx, bucket.overflow_location, linear_hash->bucket_map);
	}

	/* only to update bucket if not becoming junk bucket */
	err = linear_hash_update_bucket(bucket_loc, &bucket, linear_hash);
	linear_hash_decrement_num_records(linear_hash);

	if (err != err_ok) {
		return err;
	}

	return err;
}